

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * __thiscall
spvtools::opt::analysis::Struct::str_abi_cxx11_(string *__return_storage_ptr__,Struct *this)

{
  long lVar1;
  long lVar2;
  ostringstream oss;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"{");
  lVar1 = (long)(this->element_types_).
                super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->element_types_).
                super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
    (*(this->element_types_).
      super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar2]->_vptr_Type[3])(local_1c8);
    std::operator<<((ostream *)local_1a8,local_1c8);
    std::__cxx11::string::_M_dispose();
    if (lVar1 + -1 != lVar2) {
      std::operator<<((ostream *)local_1a8,", ");
    }
  }
  std::operator<<((ostream *)local_1a8,"}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Struct::str() const {
  std::ostringstream oss;
  oss << "{";
  const size_t count = element_types_.size();
  for (size_t i = 0; i < count; ++i) {
    oss << element_types_[i]->str();
    if (i + 1 != count) oss << ", ";
  }
  oss << "}";
  return oss.str();
}